

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O2

void __thiscall UDPSplitPacketReader::SplitPacket::SplitPacket(SplitPacket *this,int size)

{
  *(undefined ***)&this->field_0x48 = &PTR___cxa_pure_virtual_00116d68;
  BufferReader::BufferReader(&this->super_BufferReader,&PTR_construction_vtable_24__00116c50,size);
  (this->super_BufferReader).super_Buffer._vptr_Buffer = (_func_int **)0x116c08;
  *(undefined8 *)&this->field_0x48 = 0x116c40;
  *(undefined8 *)&(this->super_BufferReader).field_0x28 = 0;
  (this->previous)._M_node = (_List_node_base *)0x0;
  *(undefined8 *)((long)&(this->previous)._M_node + 4) = 0;
  *(undefined8 *)((long)&(this->start)._M_node + 4) = 0;
  return;
}

Assistant:

UDPSplitPacketReader::SplitPacket::SplitPacket(int size) : BufferReader(size) {
  hasNext = hasPrevious = hasStart = hasEnd = false;
}